

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::onRequest(Connection *this,Request *request)

{
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  HttpInputStreamImpl *this_01;
  Own<kj::HttpService,_std::nullptr_t> *attachments;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  PromiseAwaiter<void> *pPVar2;
  Connection *this_02;
  HttpOutputStream *this_03;
  Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>,_kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>
  *params_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_04;
  undefined4 uVar3;
  Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *pOVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  SourceLocation location;
  bool bVar12;
  LoopResult LVar13;
  coroutine_handle<void> handle;
  void *pvVar14;
  undefined4 *in_RDX;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *pPVar15;
  PromiseAwaiter<bool> *__return_storage_ptr__;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>,_kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>_>
  *location_00;
  Fault local_a0;
  anon_class_24_3_9e98ddcd local_98;
  OwnOwn<kj::HttpService,_std::nullptr_t> _kj_result;
  undefined4 local_48 [2];
  undefined4 local_40;
  undefined8 local_38;
  
  handle._M_fr_ptr = operator_new(0xbf0);
  *(code **)handle._M_fr_ptr = onRequest;
  *(code **)((long)handle._M_fr_ptr + 8) = onRequest;
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)((long)handle._M_fr_ptr + 0x10);
  *(Request **)((long)handle._M_fr_ptr + 0xbe0) = request;
  local_98.body = (Own<kj::AsyncInputStream,_std::nullptr_t> *)0x4d3fd6;
  local_98.dummy =
       (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)0x4d6fba;
  local_98.this = (Connection *)0x1b00001e2a;
  location.function = "onRequest";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1e2a;
  location.columnNumber = 0x1b;
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::get_return_object
            ((Coroutine<kj::HttpServer::Connection::LoopResult> *)this);
  local_98.body = (Own<kj::AsyncInputStream,_std::nullptr_t> *)CONCAT44(local_98.body._4_4_,1);
  local_98.dummy =
       (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)
       CONCAT44(local_98.dummy._4_4_,*in_RDX);
  kj::_::NullableValue<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>::
  emplace<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>
            ((NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)
             &request[0xd].url.content.size_,
             (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&local_98);
  uVar3 = *in_RDX;
  uVar8 = in_RDX[2];
  uVar9 = in_RDX[3];
  uVar10 = in_RDX[4];
  uVar11 = in_RDX[5];
  *(undefined4 *)((long)handle._M_fr_ptr + 0xad0) = 1;
  *(undefined4 *)((long)handle._M_fr_ptr + 0xad8) = uVar3;
  *(undefined4 *)((long)handle._M_fr_ptr + 0xae0) = uVar8;
  *(undefined4 *)((long)handle._M_fr_ptr + 0xae4) = uVar9;
  *(undefined4 *)((long)handle._M_fr_ptr + 0xae8) = uVar10;
  *(undefined4 *)((long)handle._M_fr_ptr + 0xaec) = uVar11;
  *(StringPtr **)((long)handle._M_fr_ptr + 0xaf0) = &request[5].url;
  *(Request **)((long)handle._M_fr_ptr + 0xaf8) = request;
  (**(code **)**(undefined8 **)(request + 2))
            ((Own<kj::HttpService,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0xb80),
             *(undefined8 **)(request + 2),(long)handle._M_fr_ptr + 0xad0);
  if (*(char *)((long)&request[0xe].url.content.size_ + 6) == '\x01') {
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
    ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                    *)this_00,BREAK_LOOP_CONN_ERR);
    goto LAB_003a4818;
  }
  _kj_result.value.disposer = *(Disposer **)((long)handle._M_fr_ptr + 0xb80);
  pOVar4 = *(Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> **)
            ((long)handle._M_fr_ptr + 0xb88);
  *(undefined8 *)((long)handle._M_fr_ptr + 0xb88) = 0;
  if (pOVar4 == (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)0x0) {
    _kj_result.value.ptr = (HttpService *)pOVar4;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
              (&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1e37,FAILED,"kj::mv(maybeService) != nullptr",
               "\"SuspendableHttpServiceFactory did not suspend, but returned kj::none.\"",
               (char (*) [70])
               "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");
    kj::_::Debug::Fault::fatal(&local_a0);
  }
  _kj_result.value.ptr = (HttpService *)0x0;
  local_98.body = (Own<kj::AsyncInputStream,_std::nullptr_t> *)_kj_result.value.disposer;
  local_98.dummy = pOVar4;
  Own<kj::HttpService,_std::nullptr_t>::dispose(&_kj_result.value);
  *(Own<kj::AsyncInputStream,_std::nullptr_t> **)((long)handle._M_fr_ptr + 0xb70) = local_98.body;
  *(Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> **)
   ((long)handle._M_fr_ptr + 0xb78) = local_98.dummy;
  local_98.dummy = (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)0x0
  ;
  Own<kj::HttpService,_std::nullptr_t>::dispose((Own<kj::HttpService,_std::nullptr_t> *)&local_98);
  this_01 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0xb60);
  local_48[0] = 1;
  local_40 = *in_RDX;
  anon_unknown_36::HttpInputStreamImpl::getEntityBody
            (this_01,(int)request + 0x38,(OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,
             (uint)local_48,(HttpHeaders *)0x0);
  local_48[0] = 0;
  attachments = (Own<kj::HttpService,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0xbc8);
  (**(code **)**(undefined8 **)((long)handle._M_fr_ptr + 0xb78))
            (attachments,*(undefined8 **)((long)handle._M_fr_ptr + 0xb78),*in_RDX,
             *(undefined8 *)(in_RDX + 2),*(undefined8 *)(in_RDX + 4),&request[5].url,
             *(undefined8 *)((long)handle._M_fr_ptr + 0xb68),request);
  pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0xbd0);
  Promise<void>::attach<kj::Own<kj::HttpService,decltype(nullptr)>>
            ((Promise<void> *)pOVar1,attachments);
  pPVar2 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x5a8);
  co_await<void>(pPVar2,(Promise<void> *)pOVar1);
  *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 0;
  bVar12 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                     ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
  if (bVar12) {
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
  kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar1);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)attachments);
  lVar5 = *(long *)((long)handle._M_fr_ptr + 0xbe0);
  if (*(char *)(lVar5 + 0x168) == '\x01') {
    pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0xbc0);
    pOVar1->ptr = *(PromiseNode **)(lVar5 + 0x170);
    *(undefined8 *)(lVar5 + 0x170) = 0;
    Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
              ((Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)(lVar5 + 0x168));
    pPVar15 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
              ((long)handle._M_fr_ptr + 0x760);
    co_await<kj::HttpServer::Connection::LoopResult>
              (pPVar15,(Promise<kj::HttpServer::Connection::LoopResult> *)pOVar1);
    *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 1;
    bVar12 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                       ((PromiseAwaiterBase *)pPVar15,(CoroutineBase *)this_00);
    if (bVar12) {
      return (PromiseBase)(PromiseBase)this;
    }
    LVar13 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume(pPVar15);
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
    ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                    *)this_00,LVar13);
    kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter(pPVar15);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar1);
  }
  else {
    LVar13 = BREAK_LOOP_CONN_ERR;
    if (*(char *)(lVar5 + 0x162) == '\x01') {
      if (*(char *)(lVar5 + 0x163) == '\0') {
        if (kj::_::Debug::minSeverity < 4) {
          kj::_::Debug::log<char_const(&)[90]>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x1e51,FATAL,
                     "\"Accepted WebSocket object must be destroyed before HttpService \" \"request handler completes.\""
                     ,(char (*) [90])
                      "Accepted WebSocket object must be destroyed before HttpService request handler completes."
                    );
        }
        abort();
      }
    }
    else {
      if (*(char *)(lVar5 + 0x148) == '\x01') {
        this_02 = (Connection *)((long)handle._M_fr_ptr + 3000);
        sendError(this_02);
        pPVar15 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
                  ((long)handle._M_fr_ptr + 0x3f0);
        co_await<kj::HttpServer::Connection::LoopResult>
                  (pPVar15,(Promise<kj::HttpServer::Connection::LoopResult> *)this_02);
        *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 2;
        bVar12 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                           ((PromiseAwaiterBase *)pPVar15,(CoroutineBase *)this_00);
        if (bVar12) {
          return (PromiseBase)(PromiseBase)this;
        }
        LVar13 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                           (pPVar15);
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                        *)this_00,LVar13);
        kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter(pPVar15);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_02);
        goto LAB_003a4804;
      }
      if (*(char *)(lVar5 + 0x141) == '\0') {
        this_03 = (HttpOutputStream *)((long)handle._M_fr_ptr + 0xbb0);
        anon_unknown_36::HttpOutputStream::flush(this_03);
        pPVar2 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
        co_await<void>(pPVar2,(Promise<void> *)this_03);
        *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 3;
        bVar12 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                           ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
        if (bVar12) {
          return (PromiseBase)(PromiseBase)this;
        }
        kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
        kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar2);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_03);
        lVar5 = *(long *)((long)handle._M_fr_ptr + 0xbe0);
        if ((*(char *)(lVar5 + 0x109) != '\0') || (*(int *)(lVar5 + 0x10c) != 0)) {
          heap<kj::(anonymous_namespace)::HttpDiscardingEntityWriter>();
          local_98.this = *(Connection **)((long)handle._M_fr_ptr + 0xbe0);
          local_98.body = (Own<kj::AsyncInputStream,_std::nullptr_t> *)this_01;
          local_98.dummy =
               (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)
               ((long)handle._M_fr_ptr + 0xb50);
          evalNow<kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda()_1_>
                    ((kj *)&local_a0,&local_98);
          *(char **)((long)handle._M_fr_ptr + 0xb38) =
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
          ;
          *(char **)((long)handle._M_fr_ptr + 0xb40) = "onRequest";
          *(undefined8 *)((long)handle._M_fr_ptr + 0xb48) = 0x1a00001e8a;
          Promise<unsigned_long>::
          catch_<kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda(kj::Exception&&)_1_>
                    ((Promise<unsigned_long> *)&_kj_result,
                     (anon_class_1_0_00000001_for_errorHandler *)&local_a0,
                     *(SourceLocation *)((long)handle._M_fr_ptr + 0xb38));
          pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                   ((long)handle._M_fr_ptr + 0xba0);
          local_38 = *(undefined8 *)((long)handle._M_fr_ptr + 0xbe0);
          Promise<unsigned_long>::
          then<kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda(unsigned_long)_1_>
                    ((Promise<unsigned_long> *)pOVar1,
                     (anon_class_8_1_8991fb9c_for_func *)&_kj_result);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kj_result);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_a0);
          params_1 = (Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>,_kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>
                      *)((long)handle._M_fr_ptr + 0xb00);
          *(undefined8 *)((long)handle._M_fr_ptr + 0xb00) =
               *(undefined8 *)((long)handle._M_fr_ptr + 0xb50);
          *(undefined8 *)((long)handle._M_fr_ptr + 0xb08) =
               *(undefined8 *)((long)handle._M_fr_ptr + 0xb58);
          *(undefined8 *)((long)handle._M_fr_ptr + 0xb58) = 0;
          *(undefined8 *)((long)handle._M_fr_ptr + 0xb10) =
               *(undefined8 *)((long)handle._M_fr_ptr + 0xb60);
          *(undefined8 *)((long)handle._M_fr_ptr + 0xb18) =
               *(undefined8 *)((long)handle._M_fr_ptr + 0xb68);
          *(undefined8 *)((long)handle._M_fr_ptr + 0xb68) = 0;
          lVar5 = *(long *)((long)handle._M_fr_ptr + 0xba0);
          lVar6 = *(long *)(lVar5 + 8);
          if (lVar6 == 0 || (ulong)(lVar5 - lVar6) < 0x38) {
            pvVar14 = operator_new(0x400);
            location_00 = (AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>,_kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>_>
                           *)((long)pvVar14 + 0x3c8);
            ctor<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>,kj::Own<kj::AsyncInputStream,decltype(nullptr)>>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>,kj::Own<kj::AsyncInputStream,decltype(nullptr)>>>
                      (location_00,pOVar1,params_1);
            *(void **)((long)pvVar14 + 0x3d0) = pvVar14;
          }
          else {
            *(undefined8 *)(lVar5 + 8) = 0;
            location_00 = (AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>,_kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>_>
                           *)(lVar5 + -0x38);
            ctor<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>,kj::Own<kj::AsyncInputStream,decltype(nullptr)>>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>,kj::Own<kj::AsyncInputStream,decltype(nullptr)>>>
                      (location_00,pOVar1,params_1);
            *(long *)(lVar5 + -0x30) = lVar6;
          }
          ((Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>,_kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>_>,_kj::_::PromiseDisposer>
            *)((long)handle._M_fr_ptr + 0xba8))->ptr =
               (AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>,_kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>_>
                *)0x0;
          ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0xbd8))->ptr
               = (PromiseNode *)0x0;
          local_98.body = (Own<kj::AsyncInputStream,_std::nullptr_t> *)location_00;
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                     ((long)handle._M_fr_ptr + 0xbd8));
          Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>,_kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>_>,_kj::_::PromiseDisposer>
          ::~Own((Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>,_kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>_>,_kj::_::PromiseDisposer>
                  *)((long)handle._M_fr_ptr + 0xba8));
          kj::_::
          Tuple<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>,_kj::Own<kj::AsyncInputStream,_std::nullptr_t>_>
          ::~Tuple(params_1);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                    (pOVar1,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_98);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_98);
          lVar5 = *(long *)(*(long *)((long)handle._M_fr_ptr + 0xbe0) + 0x18);
          plVar7 = *(long **)(lVar5 + 8);
          (**(code **)(*plVar7 + 0x10))(&local_98,plVar7,*(undefined8 *)(lVar5 + 0x40));
          Promise<void>::
          then<kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda()_2_>
                    ((Promise<void> *)((long)handle._M_fr_ptr + 0xb90),
                     (anon_class_1_0_00000001_for_func *)&local_98);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_98);
          this_04 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                    ((long)handle._M_fr_ptr + 0xb98);
          *(char **)((long)handle._M_fr_ptr + 0xb20) =
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
          ;
          *(char **)((long)handle._M_fr_ptr + 0xb28) = "onRequest";
          *(undefined8 *)((long)handle._M_fr_ptr + 0xb30) = 0x1d00001e9f;
          Promise<bool>::exclusiveJoin
                    ((Promise<bool> *)this_04,(Promise<bool> *)pOVar1,
                     *(SourceLocation *)((long)handle._M_fr_ptr + 0xb20));
          __return_storage_ptr__ = (PromiseAwaiter<bool> *)((long)handle._M_fr_ptr + 0x918);
          co_await<bool>(__return_storage_ptr__,(Promise<bool> *)this_04);
          *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 4;
          bVar12 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                             ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00)
          ;
          if (bVar12) {
            return (PromiseBase)(PromiseBase)this;
          }
          bVar12 = kj::_::PromiseAwaiter<bool>::await_resume(__return_storage_ptr__);
          kj::_::PromiseAwaiter<bool>::~PromiseAwaiter(__return_storage_ptr__);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_04);
          LVar13 = BREAK_LOOP_CONN_ERR;
          if (bVar12) {
            LVar13 = (*(byte *)(*(long *)((long)handle._M_fr_ptr + 0xbe0) + 0x164) & 1) * 2;
          }
          kj::_::
          CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
          ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                          *)this_00,LVar13);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                     ((long)handle._M_fr_ptr + 0xb90));
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar1);
          Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>::~Own
                    ((Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)
                     ((long)handle._M_fr_ptr + 0xb50));
          goto LAB_003a4804;
        }
        LVar13 = (uint)*(byte *)(lVar5 + 0x164) * 2;
      }
    }
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
    ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                    *)this_00,LVar13);
  }
LAB_003a4804:
  Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
            ((Own<kj::AsyncInputStream,_std::nullptr_t> *)this_01);
  Own<kj::HttpService,_std::nullptr_t>::dispose
            ((Own<kj::HttpService,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0xb70));
LAB_003a4818:
  Own<kj::HttpService,_std::nullptr_t>::dispose
            ((Own<kj::HttpService,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0xb80));
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 5;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> onRequest(HttpHeaders::Request& request) {
    auto& headers = httpInput.getHeaders();

    currentMethod = request.method;

    SuspendableRequest suspendable(*this, request.method, request.url, headers);
    auto maybeService = factory(suspendable);

    if (suspended) {
      co_return BREAK_LOOP_CONN_ERR;
    }

    auto service = KJ_ASSERT_NONNULL(kj::mv(maybeService),
        "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");

    // TODO(perf): If the client disconnects, should we cancel the response? Probably, to
    //   prevent permanent deadlock. It's slightly weird in that arguably the client should
    //   be able to shutdown the upstream but still wait on the downstream, but I believe many
    //   other HTTP servers do similar things.

    auto body = httpInput.getEntityBody(
        HttpInputStreamImpl::REQUEST, request.method, 0, headers);

    co_await service->request(
        request.method, request.url, headers, *body, *this).attach(kj::mv(service));
    // Response done. Await next request.

    KJ_IF_SOME(p, webSocketError) {
      // sendWebSocketError() was called. Finish sending and close the connection.
      auto promise = kj::mv(p);
      webSocketError = kj::none;
      co_return co_await promise;
    }

    if (upgraded) {
      // We've upgraded to WebSocket, and by now we should have closed the WebSocket.
      if (!webSocketOrConnectClosed) {
        // This is gonna segfault later so abort now instead.
        KJ_LOG(FATAL, "Accepted WebSocket object must be destroyed before HttpService "
                      "request handler completes.");
        abort();
      }

      // Once we start a WebSocket there's no going back to HTTP.
      co_return BREAK_LOOP_CONN_ERR;
    }

    if (currentMethod != kj::none) {
      co_return co_await sendError();
    }

    if (httpOutput.isBroken()) {
      // We started a response but didn't finish it. But HttpService returns success?
      // Perhaps it decided that it doesn't want to finish this response. We'll have to
      // disconnect here. If the response body is not complete (e.g. Content-Length not
      // reached), the client should notice. We don't want to log an error because this
      // condition might be intentional on the service's part.
      co_return BREAK_LOOP_CONN_ERR;
    }

    co_await httpOutput.flush();

    if (httpInput.canReuse()) {
      // Things look clean. Go ahead and accept the next request.

      if (closeAfterSend) {
        // We sent Connection: close, so drop the connection now.
        co_return BREAK_LOOP_CONN_ERR;
      } else {
        // Note that we don't have to handle server.draining here because we'll take care
        // of it the next time around the loop.
        co_return CONTINUE_LOOP;
      }
    } else {
      // Apparently, the application did not read the request body. Maybe this is a bug,
      // or maybe not: maybe the client tried to upload too much data and the application
      // legitimately wants to cancel the upload without reading all it it.
      //
      // We have a problem, though: We did send a response, and we didn't send
      // `Connection: close`, so the client may expect that it can send another request.
      // Perhaps the client has even finished sending the previous request's body, in
      // which case the moment it finishes receiving the response, it could be completely
      // within its rights to start a new request. If we close the socket now, we might
      // interrupt that new request.
      //
      // Or maybe we did send `Connection: close`, as indicated by `closeAfterSend` being
      // true. Even in that case, we should still try to read and ignore the request,
      // otherwise when we close the connection the client may get a "connection reset"
      // error before they get a chance to actually read the response body that we sent
      // them.
      //
      // There's no way we can get out of this perfectly cleanly. HTTP just isn't good
      // enough at connection management. The best we can do is give the client some grace
      // period and then abort the connection.

      auto dummy = kj::heap<HttpDiscardingEntityWriter>();
      auto lengthGrace = kj::evalNow([&]() {
        return body->pumpTo(*dummy, server.settings.canceledUploadGraceBytes);
      }).catch_([](kj::Exception&& e) -> uint64_t {
        // Reading from the input failed in some way. This may actually be the whole
        // reason we got here in the first place so don't propagate this error, just
        // give up on discarding the input.
        return 0;  // This zero is ignored but `canReuse()` will return false below.
      }).then([this](uint64_t amount) {
        if (httpInput.canReuse()) {
          // Success, we can continue.
          return true;
        } else {
          // Still more data. Give up.
          return false;
        }
      });
      lengthGrace = lengthGrace.attach(kj::mv(dummy), kj::mv(body));

      auto timeGrace = server.timer.afterDelay(server.settings.canceledUploadGracePeriod)
          .then([]() { return false; });

      auto clean = co_await lengthGrace.exclusiveJoin(kj::mv(timeGrace));
      if (clean && !closeAfterSend) {
        // We recovered. Continue loop.
        co_return CONTINUE_LOOP;
      } else {
        // Client still not done, or we sent Connection: close and so want to drop the
        // connection anyway. Return broken.
        co_return BREAK_LOOP_CONN_ERR;
      }
    }
  }